

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O1

char * __thiscall google::protobuf::Field::_InternalParse(Field *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  ArenaStringPtr *this_03;
  ArenaStringPtr *this_04;
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  string *psVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  Option *msg;
  uint uVar11;
  char *field_name;
  char *pcVar12;
  uint32 uVar13;
  Arena *pAVar14;
  UnknownFieldSet *unknown;
  byte *p;
  internal *this_05;
  char cVar15;
  uint res;
  pair<const_char_*,_unsigned_int> pVar16;
  pair<const_char_*,_unsigned_long> pVar17;
  pair<const_char_*,_unsigned_long> pVar18;
  pair<const_char_*,_unsigned_long> pVar19;
  StringPiece str;
  byte *local_38;
  char *ptr_local;
  char *size;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  this_01 = &this->default_value_;
  this_02 = &this->json_name_;
  this_03 = &this->type_url_;
  this_04 = &this->name_;
  local_38 = (byte *)ptr;
  do {
    bVar10 = internal::EpsCopyInputStream::DoneWithCheck
                       (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar10) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    res = (uint)bVar1;
    p = local_38 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
      if ((char)*p < '\0') {
        pVar16 = internal::ReadTagFallback((char *)local_38,res);
        p = (byte *)pVar16.first;
        res = pVar16.second;
      }
      else {
        p = local_38 + 2;
      }
    }
    local_38 = p;
    if (p == (byte *)0x0) {
LAB_00303dd2:
      cVar15 = '\x04';
      goto LAB_00303dc7;
    }
    uVar11 = (res >> 3) - 1;
    if (10 < uVar11) goto switchD_003038c7_caseD_5;
    field_name = (char *)((long)&switchD_003038c7::switchdataD_0035e328 +
                         (long)(int)(&switchD_003038c7::switchdataD_0035e328)[uVar11]);
    cVar15 = (char)res;
    switch(res >> 3) {
    case 1:
      if (cVar15 != '\b') break;
      bVar1 = *p;
      auVar8._8_8_ = (long)(char)bVar1;
      auVar8._0_8_ = p + 1;
      auVar6 = auVar8._0_12_;
      if ((long)(char)bVar1 < 0) {
        bVar2 = p[1];
        uVar13 = ((uint)bVar2 * 0x80 + (uint)bVar1) - 0x80;
        if ((char)bVar2 < '\0') {
          pVar19 = internal::VarintParseSlow64((char *)p,uVar13);
          auVar6 = pVar19._0_12_;
        }
        else {
          auVar6._8_4_ = uVar13;
          auVar6._0_8_ = p + 2;
        }
      }
      local_38 = auVar6._0_8_;
      cVar15 = '\x04';
      if (local_38 != (byte *)0x0) {
        this->kind_ = auVar6._8_4_;
LAB_00303d9a:
        cVar15 = '\x02';
      }
      goto LAB_00303dc7;
    case 2:
      if (cVar15 == '\x10') {
        bVar1 = *p;
        auVar9._8_8_ = (long)(char)bVar1;
        auVar9._0_8_ = p + 1;
        auVar7 = auVar9._0_12_;
        if ((long)(char)bVar1 < 0) {
          bVar2 = p[1];
          uVar13 = ((uint)bVar2 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)bVar2 < '\0') {
            pVar19 = internal::VarintParseSlow64((char *)p,uVar13);
            auVar7 = pVar19._0_12_;
          }
          else {
            auVar7._8_4_ = uVar13;
            auVar7._0_8_ = p + 2;
          }
        }
        local_38 = auVar7._0_8_;
        cVar15 = '\x04';
        if (local_38 != (byte *)0x0) {
          this->cardinality_ = auVar7._8_4_;
          goto LAB_00303d9a;
        }
        goto LAB_00303dc7;
      }
      break;
    case 3:
      if (cVar15 == '\x18') {
        bVar1 = *p;
        pVar17.second = (long)(char)bVar1;
        pVar17.first = (char *)p;
        local_38 = p + 1;
        if ((long)(char)bVar1 < 0) {
          uVar13 = ((uint)*local_38 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar17 = internal::VarintParseSlow64((char *)p,uVar13);
          }
          else {
            pVar17.second._0_4_ = uVar13;
            pVar17.first = (char *)(p + 2);
            pVar17.second._4_4_ = 0;
          }
          local_38 = (byte *)pVar17.first;
        }
        this->number_ = (int32)pVar17.second;
LAB_00303db8:
        cVar15 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
        goto LAB_00303dc7;
      }
      break;
    case 4:
      if (cVar15 == '\"') {
        pAVar14 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar14 & 1) != 0) {
          pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
        }
        if (this_04->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_04,pAVar14,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        psVar5 = this_04->ptr_;
        local_38 = (byte *)internal::InlineGreedyStringParser(psVar5,(char *)local_38,ctx);
        this_05 = (internal *)(psVar5->_M_dataplus)._M_p;
        size = (char *)psVar5->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        pcVar12 = "google.protobuf.Field.name";
LAB_00303ca4:
        str.length_ = (stringpiece_ssize_type)pcVar12;
        str.ptr_ = size;
        bVar10 = internal::VerifyUTF8(this_05,str,field_name);
        cVar15 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
        if (!bVar10) {
          cVar15 = '\x04';
        }
        goto LAB_00303dc7;
      }
      break;
    case 6:
      if (cVar15 == '2') {
        pAVar14 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar14 & 1) != 0) {
          pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
        }
        if (this_03->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_03,pAVar14,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        psVar5 = this_03->ptr_;
        local_38 = (byte *)internal::InlineGreedyStringParser(psVar5,(char *)local_38,ctx);
        this_05 = (internal *)(psVar5->_M_dataplus)._M_p;
        size = (char *)psVar5->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        pcVar12 = "google.protobuf.Field.type_url";
        goto LAB_00303ca4;
      }
      break;
    case 7:
      if (cVar15 == '8') {
        bVar1 = *p;
        pVar18.second = (long)(char)bVar1;
        pVar18.first = (char *)p;
        local_38 = p + 1;
        if ((long)(char)bVar1 < 0) {
          uVar13 = ((uint)*local_38 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar18 = internal::VarintParseSlow64((char *)p,uVar13);
          }
          else {
            pVar18.second._0_4_ = uVar13;
            pVar18.first = (char *)(p + 2);
            pVar18.second._4_4_ = 0;
          }
          local_38 = (byte *)pVar18.first;
        }
        this->oneof_index_ = (int32)pVar18.second;
        goto LAB_00303db8;
      }
      break;
    case 8:
      if (cVar15 == '@') {
        bVar1 = *p;
        pVar19.second = (long)(char)bVar1;
        pVar19.first = (char *)p;
        local_38 = p + 1;
        if ((long)(char)bVar1 < 0) {
          uVar13 = ((uint)*local_38 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar19 = internal::VarintParseSlow64((char *)p,uVar13);
          }
          else {
            pVar19.second._0_4_ = uVar13;
            pVar19.first = (char *)(p + 2);
            pVar19.second._4_4_ = 0;
          }
          local_38 = (byte *)pVar19.first;
        }
        this->packed_ = pVar19.second != 0;
        goto LAB_00303db8;
      }
      break;
    case 9:
      if (cVar15 == 'J') {
        local_38 = p + -1;
        do {
          local_38 = local_38 + 1;
          pRVar4 = (this->options_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
LAB_00303a1d:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->options_).super_RepeatedPtrFieldBase,
                       (this->options_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_00303a2c:
            pRVar4 = (this->options_).super_RepeatedPtrFieldBase.rep_;
            pRVar4->allocated_size = pRVar4->allocated_size + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::Option>
                            ((this->options_).super_RepeatedPtrFieldBase.arena_);
            pRVar4 = (this->options_).super_RepeatedPtrFieldBase.rep_;
            iVar3 = (this->options_).super_RepeatedPtrFieldBase.current_size_;
            (this->options_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            pRVar4->elements[iVar3] = msg;
          }
          else {
            iVar3 = (this->options_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar4->allocated_size <= iVar3) {
              if (pRVar4->allocated_size == (this->options_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00303a1d;
              goto LAB_00303a2c;
            }
            (this->options_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (Option *)pRVar4->elements[iVar3];
          }
          local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::Option>
                                       (ctx,msg,(char *)local_38);
          if (local_38 == (byte *)0x0) goto LAB_00303dd2;
          cVar15 = '\x02';
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x4a));
        goto LAB_00303dc7;
      }
      break;
    case 10:
      if (cVar15 == 'R') {
        pAVar14 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar14 & 1) != 0) {
          pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
        }
        if (this_02->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_02,pAVar14,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        psVar5 = this_02->ptr_;
        local_38 = (byte *)internal::InlineGreedyStringParser(psVar5,(char *)local_38,ctx);
        this_05 = (internal *)(psVar5->_M_dataplus)._M_p;
        size = (char *)psVar5->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        pcVar12 = "google.protobuf.Field.json_name";
        goto LAB_00303ca4;
      }
      break;
    case 0xb:
      if (cVar15 == 'Z') {
        pAVar14 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar14 & 1) != 0) {
          pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
        }
        if (this_01->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_01,pAVar14,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        psVar5 = this_01->ptr_;
        local_38 = (byte *)internal::InlineGreedyStringParser(psVar5,(char *)local_38,ctx);
        this_05 = (internal *)(psVar5->_M_dataplus)._M_p;
        size = (char *)psVar5->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        pcVar12 = "google.protobuf.Field.default_value";
        goto LAB_00303ca4;
      }
    }
switchD_003038c7_caseD_5:
    if (res == 0 || (res & 7) == 4) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
      cVar15 = '\t';
    }
    else {
      if (((ulong)this_00->ptr_ & 1) == 0) {
        unknown = internal::InternalMetadata::
                  mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
      }
      else {
        unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
      }
      local_38 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
      cVar15 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
    }
LAB_00303dc7:
    if (cVar15 != '\x02') {
      if (cVar15 == '\x04') {
        local_38 = (byte *)0x0;
      }
      return (char *)local_38;
    }
  } while( true );
}

Assistant:

const char* Field::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // .google.protobuf.Field.Kind kind = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_kind(static_cast<PROTOBUF_NAMESPACE_ID::Field_Kind>(val));
        } else goto handle_unusual;
        continue;
      // .google.protobuf.Field.Cardinality cardinality = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_cardinality(static_cast<PROTOBUF_NAMESPACE_ID::Field_Cardinality>(val));
        } else goto handle_unusual;
        continue;
      // int32 number = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          number_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // string name = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Field.name"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // string type_url = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          auto str = _internal_mutable_type_url();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Field.type_url"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // int32 oneof_index = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 56)) {
          oneof_index_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // bool packed = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 64)) {
          packed_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.Option options = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_options(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<74>(ptr));
        } else goto handle_unusual;
        continue;
      // string json_name = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          auto str = _internal_mutable_json_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Field.json_name"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // string default_value = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 90)) {
          auto str = _internal_mutable_default_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Field.default_value"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}